

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::vec_add_trunc_multipredict<dense_parameters>
               (multipredict_info<dense_parameters> *mp,float fx,uint64_t fi)

{
  float *pfVar1;
  size_t in_RSI;
  ulong *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  size_t c;
  size_t index;
  float in_stack_ffffffffffffffd0;
  float w;
  ulong local_28;
  size_t local_20;
  
  local_20 = in_RSI;
  for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
    w = in_XMM0_Da;
    dense_parameters::operator[]((dense_parameters *)in_RDI[3],local_20);
    fVar2 = trunc_weight(w,in_stack_ffffffffffffffd0);
    pfVar1 = (float *)(in_RDI[2] + local_28 * 0x20);
    *pfVar1 = w * fVar2 + *pfVar1;
    local_20 = in_RDI[1] + local_20;
  }
  return;
}

Assistant:

inline void vec_add_trunc_multipredict(multipredict_info<T>& mp, const float fx, uint64_t fi)
{
  size_t index = fi;
  for (size_t c = 0; c < mp.count; c++, index += mp.step)
    mp.pred[c].scalar += fx * trunc_weight(mp.weights[index], mp.gravity);
}